

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cExplicitUniformLocationTest.cpp
# Opt level: O3

void __thiscall
glcts::anon_unknown_0::Uniform::Uniform
          (Uniform *this,UniformValueGenerator *generator,UniformType *_type,Loc _location,
          DefOccurence _declOccurence,DefOccurence _usageOccurence)

{
  pointer pUVar1;
  int iVar2;
  ulong uVar3;
  int iVar4;
  pointer pUVar5;
  ulong uVar6;
  uint uVar7;
  long lVar8;
  Loc _location_00;
  UniformType local_298;
  Uniform local_208;
  
  UniformType::UniformType(&this->type,_type);
  (this->location).super_LayoutSpecifierBase.val = (int)_location.super_LayoutSpecifierBase._0_8_;
  (this->location).super_LayoutSpecifierBase.numSys =
       (int)((ulong)_location.super_LayoutSpecifierBase._0_8_ >> 0x20);
  (this->location).super_LayoutSpecifierBase.occurence.occurence =
       _location.super_LayoutSpecifierBase.occurence.occurence.occurence;
  (this->declOccurence).occurence = _declOccurence.occurence;
  (this->usageOccurence).occurence = _usageOccurence.occurence;
  UniformValue::UniformValue(&this->value,_type,generator);
  (this->childUniforms).
  super__Vector_base<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->childUniforms).
  super__Vector_base<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->childUniforms).
  super__Vector_base<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->name)._M_dataplus._M_p = (pointer)&(this->name).field_2;
  (this->name)._M_string_length = 0;
  (this->name).field_2._M_local_buf[0] = '\0';
  (this->shortName)._M_dataplus._M_p = (pointer)&(this->shortName).field_2;
  (this->shortName)._M_string_length = 0;
  (this->shortName).field_2._M_local_buf[0] = '\0';
  if ((this->type).baseType == 0) {
    iVar2 = (this->type).arraySize;
    if (0 < iVar2) {
      uVar7 = (this->location).super_LayoutSpecifierBase.val;
      pUVar5 = (this->type).childTypes.
               super__Vector_base<glcts::(anonymous_namespace)::UniformType,_std::allocator<glcts::(anonymous_namespace)::UniformType>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pUVar1 = (this->type).childTypes.
               super__Vector_base<glcts::(anonymous_namespace)::UniformType,_std::allocator<glcts::(anonymous_namespace)::UniformType>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      iVar4 = 0;
      do {
        if (pUVar1 != pUVar5) {
          lVar8 = 0;
          uVar6 = 0;
          do {
            UniformType::UniformType(&local_298,(UniformType *)((long)&pUVar5->enumType + lVar8));
            uVar3 = 1999999;
            if (0 < (int)uVar7) {
              uVar3 = (ulong)uVar7;
            }
            _location_00.super_LayoutSpecifierBase.occurence.occurence = (uint)((int)uVar7 < 1) * 5;
            _location_00.super_LayoutSpecifierBase.val = (int)uVar3;
            _location_00.super_LayoutSpecifierBase.numSys = (int)(uVar3 >> 0x20);
            Uniform(&local_208,generator,&local_298,_location_00,
                    (DefOccurence)(this->declOccurence).occurence,
                    (DefOccurence)(this->usageOccurence).occurence);
            std::
            vector<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
            ::push_back(&this->childUniforms,&local_208);
            ~Uniform(&local_208);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_298.refStrType._M_dataplus._M_p != &local_298.refStrType.field_2) {
              operator_delete(local_298.refStrType._M_dataplus._M_p,
                              local_298.refStrType.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_298.strType._M_dataplus._M_p != &local_298.strType.field_2) {
              operator_delete(local_298.strType._M_dataplus._M_p,
                              local_298.strType.field_2._M_allocated_capacity + 1);
            }
            std::
            vector<glcts::(anonymous_namespace)::UniformType,_std::allocator<glcts::(anonymous_namespace)::UniformType>_>
            ::~vector(&local_298.childTypes);
            if (local_298.arraySizesSegmented.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_298.arraySizesSegmented.
                              super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start,
                              (long)local_298.arraySizesSegmented.
                                    super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_end_of_storage -
                              (long)local_298.arraySizesSegmented.
                                    super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_start);
            }
            pUVar5 = (this->type).childTypes.
                     super__Vector_base<glcts::(anonymous_namespace)::UniformType,_std::allocator<glcts::(anonymous_namespace)::UniformType>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            uVar7 = uVar7 + *(int *)((long)&pUVar5->arraySize + lVar8);
            pUVar1 = (this->type).childTypes.
                     super__Vector_base<glcts::(anonymous_namespace)::UniformType,_std::allocator<glcts::(anonymous_namespace)::UniformType>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            uVar6 = uVar6 + 1;
            lVar8 = lVar8 + 0x90;
          } while (uVar6 < (ulong)(((long)pUVar1 - (long)pUVar5 >> 4) * -0x71c71c71c71c71c7));
          iVar2 = (this->type).arraySize;
        }
        iVar4 = iVar4 + 1;
      } while (iVar4 < iVar2);
    }
  }
  return;
}

Assistant:

Uniform(UniformValueGenerator& generator, UniformType _type, Loc _location,
			DefOccurence _declOccurence = DefOccurence::ALL_SH, DefOccurence _usageOccurence = DefOccurence::ALL_SH)
		: type(_type)
		, location(_location)
		, declOccurence(_declOccurence)
		, usageOccurence(_usageOccurence)
		, value(_type, generator)
	{

		if (type.isStruct())
		{
			int currentLocation = location.val;
			for (int arrayElem = 0; arrayElem < type.arraySize; arrayElem++)
			{
				for (size_t child = 0; child < type.childTypes.size(); child++)
				{
					Loc childLocation = Loc::Implicit();
					if (currentLocation > 0)
					{
						childLocation = Loc::C(currentLocation);
					}
					childUniforms.push_back(
						Uniform(generator, type.childTypes[child], childLocation, declOccurence, usageOccurence));
					currentLocation += type.childTypes[child].arraySize;
				}
			}
		}
	}